

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall
amrex::EB2::Level::prepareForCoarsening(Level *this,Level *rhs,int max_grid_size,IntVect ngrow)

{
  BoxArray *this_00;
  DistributionMapping *dm;
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar2;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *pVVar3;
  Level *pLVar4;
  undefined8 uVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  pointer pBVar9;
  iterator __position;
  vector<amrex::Box,std::allocator<amrex::Box>> *this_02;
  long lVar10;
  int idim;
  int iVar11;
  long lVar12;
  Level *pLVar13;
  IntVect edge_type;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> covered_boxes;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> cut_boxes;
  MFIter mfi;
  BoxArray all_grids;
  FabArray<amrex::EBCellFlagFab> cflag;
  undefined1 local_318 [24];
  pointer pbStack_300;
  pointer local_2f8;
  IntVect local_2e8;
  FabFactory<amrex::FArrayBox> local_2d8;
  Level *local_2d0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_2c8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_2a8;
  Level *local_290;
  undefined1 local_288 [32];
  int local_268 [18];
  BoxArray local_220;
  FabArray<amrex::EBCellFlagFab> local_1b8;
  
  uVar2 = *(undefined8 *)(this->m_geom).domain.smallend.vect;
  local_1b8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
       (this->m_geom).domain.btype.itype;
  local_1b8.super_FabArrayBase._vptr_FabArrayBase._0_4_ = (int)uVar2;
  local_1b8.super_FabArrayBase._vptr_FabArrayBase._4_4_ = (int)((ulong)uVar2 >> 0x20);
  local_1b8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       (BATType)*(undefined8 *)((this->m_geom).domain.smallend.vect + 2);
  local_1b8.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)
       CONCAT44(local_1b8.super_FabArrayBase._vptr_FabArrayBase._4_4_ - ngrow.vect[1],
                (int)local_1b8.super_FabArrayBase._vptr_FabArrayBase - ngrow.vect[0]);
  local_1b8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
       (BATindexType)((this->m_geom).domain.bigend.vect[0] + ngrow.vect[0]);
  local_1b8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       local_1b8.super_FabArrayBase.boxarray.m_bat.m_bat_type - ngrow.vect[2];
  local_1b8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
       (IndexType)((this->m_geom).domain.bigend.vect[1] + ngrow.vect[1]);
  local_1b8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
       (this->m_geom).domain.bigend.vect[2] + ngrow.vect[2];
  BoxArray::BoxArray(&local_220,(Box *)&local_1b8);
  BoxArray::maxSize(&local_220,max_grid_size);
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)local_318,&local_220,*(int *)(ParallelContext::frames + 0x10));
  local_288._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_288._8_8_ = (FabArrayBase *)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__FabFactory_00838040;
  local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x100000001;
  local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,1);
  FabArray<amrex::EBCellFlagFab>::FabArray
            (&local_1b8,&local_220,(DistributionMapping *)local_318,1,(IntVect *)&local_2a8,
             (MFInfo *)local_288,(FabFactory<amrex::EBCellFlagFab> *)&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_288 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
  }
  fillEBCellFlag(rhs,&local_1b8,&this->m_geom);
  local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (Box *)0x0;
  local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Box *)0x0;
  local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Box *)0x0;
  local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Box *)0x0;
  local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (Box *)0x0;
  local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Box *)0x0;
  local_2d0 = this;
  local_290 = rhs;
  MFIter::MFIter((MFIter *)local_288,&local_1b8.super_FabArrayBase,'\0');
  if (local_268[0] < local_268[2]) {
    do {
      piVar6 = local_268;
      if ((Vector<int,_std::allocator<int>_> *)local_268._32_8_ !=
          (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar6 = (int *)((long)local_268[0] * 4 + *(long *)local_268._32_8_);
      }
      iVar11 = *(int *)&(local_1b8.m_fabs_v.
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar6]->
                        super_BaseFab<amrex::EBCellFlag>).field_0x44;
      BATransformer::operator()
                ((Box *)local_318,(BATransformer *)(local_288._8_8_ + 8),
                 (Box *)(*((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_288._8_8_ + 0x50))
                          ->_vptr__Sp_counted_base +
                        (long)*(int *)(*(long *)local_268._24_8_ + (long)local_268[0] * 4) * 0x1c));
      if (iVar11 != 0) {
        if (iVar11 == -1) {
          __position._M_current =
               local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pBVar9 = local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          this_02 = (vector<amrex::Box,std::allocator<amrex::Box>> *)&local_2c8;
          pVVar3 = &local_2c8;
          if (local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
LAB_0062f121:
            std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                      (this_02,__position,(Box *)local_318);
            goto LAB_0062f129;
          }
        }
        else {
          __position._M_current =
               local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
          pBVar9 = local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          this_02 = (vector<amrex::Box,std::allocator<amrex::Box>> *)&local_2a8;
          pVVar3 = &local_2a8;
          if (local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_0062f121;
        }
        (pBVar9->bigend).vect[0] = local_318._12_4_;
        (pBVar9->bigend).vect[1] = local_318._16_4_;
        (pBVar9->bigend).vect[2] = local_318._20_4_;
        (pBVar9->btype).itype = pbStack_300._0_4_;
        *(undefined8 *)(pBVar9->smallend).vect = local_318._0_8_;
        *(undefined8 *)((pBVar9->smallend).vect + 2) = local_318._8_8_;
        (pVVar3->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish = pBVar9 + 1;
      }
LAB_0062f129:
      MFIter::operator++((MFIter *)local_288);
    } while (local_268[0] < local_268[2]);
  }
  MFIter::~MFIter((MFIter *)local_288);
  AllGatherBoxes(&local_2a8,0);
  pLVar13 = local_290;
  pLVar4 = local_2d0;
  AllGatherBoxes(&local_2c8,0);
  if (local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    BoxList::BoxList((BoxList *)local_318,&local_2c8);
    BoxArray::BoxArray((BoxArray *)local_288,(BoxList *)local_318);
    BoxArray::operator=(&pLVar4->m_covered_grids,(BoxArray *)local_288);
    BoxArray::~BoxArray((BoxArray *)local_288);
    pLVar13 = local_290;
    if ((element_type *)local_318._0_8_ != (element_type *)0x0) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
      pLVar13 = local_290;
    }
  }
  if (local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    Assert_host("!cut_boxes.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_Level.cpp"
                ,0x27,"\"EB2::Level: how come there are no cut boxes?\"");
  }
  BoxList::BoxList((BoxList *)local_318,&local_2a8);
  BoxArray::BoxArray((BoxArray *)local_288,(BoxList *)local_318);
  this_00 = &pLVar4->m_grids;
  BoxArray::operator=(this_00,(BoxArray *)local_288);
  BoxArray::~BoxArray((BoxArray *)local_288);
  if ((element_type *)local_318._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
  }
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)local_288,this_00,*(int *)(ParallelContext::frames + 0x10));
  uVar5 = local_288._8_8_;
  uVar2 = local_288._0_8_;
  local_288._0_8_ = (FabArrayBase *)0x0;
  local_288._8_8_ = (FabArrayBase *)0x0;
  this_01 = (pLVar4->m_dmap).m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pLVar4->m_dmap).m_ref.
  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (pLVar4->m_dmap).m_ref.
  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if ((FabArrayBase *)local_288._8_8_ != (FabArrayBase *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
  }
  local_2e8.vect[0] = 1;
  local_2e8.vect[1] = 1;
  local_2e8.vect[2] = 1;
  convert((BoxArray *)local_288,this_00,&local_2e8);
  dm = &pLVar4->m_dmap;
  local_318._0_8_ = (element_type *)0x1;
  local_318._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_318._16_8_ = (pointer)0x0;
  pbStack_300 = (pointer)0x0;
  local_2f8 = (pointer)0x0;
  local_2d8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
  MultiFab::define(&pLVar4->m_levelset,(BoxArray *)local_288,dm,1,0,(MFInfo *)local_318,&local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_318 + 0x10));
  BoxArray::~BoxArray((BoxArray *)local_288);
  fillLevelSet(pLVar13,&pLVar4->m_levelset,&pLVar4->m_geom);
  local_288._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_288._8_8_ = (FabArrayBase *)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_2e8.vect._0_8_ = &PTR__FabFactory_00838040;
  local_318._0_8_ = (element_type *)0x200000002;
  local_318._8_4_ = 2;
  (*(pLVar4->m_cellflag).super_FabArrayBase._vptr_FabArrayBase[3])
            (&pLVar4->m_cellflag,this_00,dm,1,(FabFactory<amrex::FArrayBox> *)local_318,local_288,
             &local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_288 + 0x10));
  fillEBCellFlag(pLVar13,&pLVar4->m_cellflag,&pLVar4->m_geom);
  local_288._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_288._8_8_ = (FabArrayBase *)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_318._0_8_ = &PTR__FabFactory_008378d0;
  MultiFab::define(&pLVar4->m_volfrac,this_00,dm,1,2,(MFInfo *)local_288,
                   (FabFactory<amrex::FArrayBox> *)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_288 + 0x10));
  fillVolFrac(pLVar13,&pLVar4->m_volfrac,&pLVar4->m_geom);
  local_288._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_288._8_8_ = (FabArrayBase *)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_318._0_8_ = &PTR__FabFactory_008378d0;
  MultiFab::define(&pLVar4->m_centroid,this_00,dm,3,2,(MFInfo *)local_288,
                   (FabFactory<amrex::FArrayBox> *)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_288 + 0x10));
  fillCentroid(pLVar13,&pLVar4->m_centroid,&pLVar4->m_geom);
  local_288._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_288._8_8_ = (FabArrayBase *)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_318._0_8_ = &PTR__FabFactory_008378d0;
  MultiFab::define(&pLVar4->m_bndryarea,this_00,dm,1,2,(MFInfo *)local_288,
                   (FabFactory<amrex::FArrayBox> *)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_288 + 0x10));
  fillBndryArea(pLVar13,&pLVar4->m_bndryarea,&pLVar4->m_geom);
  local_288._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_288._8_8_ = (FabArrayBase *)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_318._0_8_ = &PTR__FabFactory_008378d0;
  MultiFab::define(&pLVar4->m_bndrycent,this_00,dm,3,2,(MFInfo *)local_288,
                   (FabFactory<amrex::FArrayBox> *)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_288 + 0x10));
  fillBndryCent(pLVar13,&pLVar4->m_bndrycent,&pLVar4->m_geom);
  local_288._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_288._8_8_ = (FabArrayBase *)0x0;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = (pointer)0x0;
  local_268._0_8_ = (pointer)0x0;
  local_318._0_8_ = &PTR__FabFactory_008378d0;
  MultiFab::define(&pLVar4->m_bndrynorm,this_00,dm,3,2,(MFInfo *)local_288,
                   (FabFactory<amrex::FArrayBox> *)local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_288 + 0x10));
  fillBndryNorm(pLVar13,&pLVar4->m_bndrynorm,&pLVar4->m_geom);
  lVar10 = 0xd48;
  lVar7 = 0x11c8;
  lVar8 = 0x1648;
  lVar12 = 0;
  do {
    iVar11 = (int)lVar12;
    if (iVar11 == 1) {
      local_2e8.vect[2] = 0;
      local_2e8.vect[0] = 0;
      local_2e8.vect[1] = 1;
    }
    else if (iVar11 == 0) {
      local_2e8.vect[0] = 1;
      local_2e8.vect[1] = 0;
      local_2e8.vect[2] = 0;
    }
    else {
      local_2e8.vect[2] = 1;
      local_2e8.vect[0] = 0;
      local_2e8.vect[1] = 0;
    }
    convert((BoxArray *)local_288,this_00,&local_2e8);
    plVar1 = (long *)((long)(local_2d0->m_geom).super_CoordSys.offset + lVar10 + -8);
    local_318._0_8_ = (element_type *)0x1;
    pbStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    local_318._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_318._16_8_ = (pointer)0x0;
    local_2d8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
    (**(code **)(*plVar1 + 0x10))(plVar1,(BoxArray *)local_288,dm,1,2,local_318,&local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_318 + 0x10));
    BoxArray::~BoxArray((BoxArray *)local_288);
    if (iVar11 == 1) {
      local_2e8.vect[2] = 0;
      local_2e8.vect[0] = 0;
      local_2e8.vect[1] = 1;
    }
    else if (iVar11 == 0) {
      local_2e8.vect[0] = 1;
      local_2e8.vect[1] = 0;
      local_2e8.vect[2] = 0;
    }
    else {
      local_2e8.vect[2] = 1;
      local_2e8.vect[0] = 0;
      local_2e8.vect[1] = 0;
    }
    convert((BoxArray *)local_288,this_00,&local_2e8);
    local_318._0_8_ = (element_type *)0x1;
    pbStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    local_318._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_318._16_8_ = (pointer)0x0;
    local_2d8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
    (**(code **)(*(long *)((long)&(local_2d0->m_cellflag).super_FabArrayBase.boxarray.m_bat.m_op +
                          lVar10 + 0x2c) + 0x10))
              ((long)(local_2d0->m_geom).super_CoordSys.offset + lVar7 + -8,(BoxArray *)local_288,dm
               ,2,2,local_318,&local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_318 + 0x10));
    BoxArray::~BoxArray((BoxArray *)local_288);
    local_2e8.vect[0] = 1;
    local_2e8.vect[1] = 1;
    local_2e8.vect[2] = 1;
    local_2e8.vect[lVar12] = 0;
    convert((BoxArray *)local_288,this_00,&local_2e8);
    local_318._0_8_ = (element_type *)0x1;
    pbStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    local_318._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_318._16_8_ = (pointer)0x0;
    local_2d8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
    (**(code **)(*(long *)((long)&(local_2d0->m_bndryarea).super_FabArray<amrex::FArrayBox>.
                                  super_FabArrayBase.boxarray.m_bat.m_op + lVar10 + 0x2c) + 0x10))
              ((long)(local_2d0->m_geom).super_CoordSys.offset + lVar8 + -8,(BoxArray *)local_288,dm
               ,1,2,local_318,&local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_318 + 0x10));
    BoxArray::~BoxArray((BoxArray *)local_288);
    pLVar13 = local_290;
    pLVar4 = local_2d0;
    lVar12 = lVar12 + 1;
    lVar10 = lVar10 + 0x180;
    lVar7 = lVar7 + 0x180;
    lVar8 = lVar8 + 0x180;
  } while (lVar12 != 3);
  local_288._0_8_ = &local_2d0->m_areafrac;
  local_288._8_8_ = (local_2d0->m_areafrac)._M_elems + 1;
  local_288._16_8_ = (local_2d0->m_areafrac)._M_elems + 2;
  fillAreaFrac(local_290,(Array<MultiFab_*,_3> *)local_288,&local_2d0->m_geom);
  local_288._0_8_ = &pLVar4->m_facecent;
  local_288._8_8_ = (pLVar4->m_facecent)._M_elems + 1;
  local_288._16_8_ = (pLVar4->m_facecent)._M_elems + 2;
  fillFaceCent(pLVar13,(Array<MultiFab_*,_3> *)local_288,&pLVar4->m_geom);
  local_288._0_8_ = &pLVar4->m_edgecent;
  local_288._8_8_ = (pLVar4->m_edgecent)._M_elems + 1;
  local_288._16_8_ = (pLVar4->m_edgecent)._M_elems + 2;
  fillEdgeCent(pLVar13,(Array<MultiFab_*,_3> *)local_288,&pLVar4->m_geom);
  pLVar4->m_ok = true;
  if (local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (Box *)0x0) {
    operator_delete(local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (Box *)0x0) {
    operator_delete(local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  FabArray<amrex::EBCellFlagFab>::~FabArray(&local_1b8);
  BoxArray::~BoxArray(&local_220);
  return;
}

Assistant:

void
Level::prepareForCoarsening (const Level& rhs, int max_grid_size, IntVect ngrow)
{
    BoxArray all_grids(amrex::grow(m_geom.Domain(),ngrow));
    all_grids.maxSize(max_grid_size);
    FabArray<EBCellFlagFab> cflag(all_grids, DistributionMapping{all_grids}, 1, 1);
    rhs.fillEBCellFlag(cflag, m_geom);

    Vector<Box> cut_boxes;
    Vector<Box> covered_boxes;

    for (MFIter mfi(cflag); mfi.isValid(); ++mfi)
    {
        FabType t = cflag[mfi].getType();
        AMREX_ASSERT(t != FabType::undefined);
        const Box& vbx = mfi.validbox();
        if (t == FabType::covered) {
            covered_boxes.push_back(vbx);
        } else if (t != FabType::regular) {
            cut_boxes.push_back(vbx);
        }
    }

    amrex::AllGatherBoxes(cut_boxes);
    amrex::AllGatherBoxes(covered_boxes);

    if (!covered_boxes.empty()) {
        m_covered_grids = BoxArray(BoxList(std::move(covered_boxes)));
    }

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!cut_boxes.empty(),
                                     "EB2::Level: how come there are no cut boxes?");

    m_grids = BoxArray(BoxList(std::move(cut_boxes)));
    m_dmap = DistributionMapping(m_grids);

    m_levelset.define(amrex::convert(m_grids,IntVect::TheNodeVector()), m_dmap, 1, 0);
    rhs.fillLevelSet(m_levelset, m_geom);

//    m_mgf.define(m_grids, m_dmap);
    const int ng = 2;
    m_cellflag.define(m_grids, m_dmap, 1, ng);
    rhs.fillEBCellFlag(m_cellflag, m_geom);

    m_volfrac.define(m_grids, m_dmap, 1, ng);
    rhs.fillVolFrac(m_volfrac, m_geom);

    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillCentroid(m_centroid, m_geom);

    m_bndryarea.define(m_grids, m_dmap, 1, ng);
    rhs.fillBndryArea(m_bndryarea, m_geom);

    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillBndryCent(m_bndrycent, m_geom);

    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillBndryNorm(m_bndrynorm, m_geom);

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng);
    }
    rhs.fillAreaFrac(amrex::GetArrOfPtrs(m_areafrac), m_geom);
    rhs.fillFaceCent(amrex::GetArrOfPtrs(m_facecent), m_geom);
    rhs.fillEdgeCent(amrex::GetArrOfPtrs(m_edgecent), m_geom);

    m_ok = true;
}